

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_remove_element(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *this_00;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjVector *in_RDI;
  size_t unaff_retaddr;
  vm_obj_id_t in_stack_0000000c;
  vm_val_t ele_val;
  size_t old_cnt;
  size_t dst;
  size_t src;
  vm_val_t *del_val;
  CVmNativeCodeDesc *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vm_val_t *in_stack_ffffffffffffffa0;
  vm_val_t *this_01;
  vm_val_t *local_48;
  
  if ((getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_remove_element::desc,1);
    __cxa_guard_release(&getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (uint *)in_RDI,in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    CVmStack::get(0);
    vm_val_t::set_obj(in_RDX,in_ESI);
    CVmStack::push(in_RDX);
    this_00 = (vm_val_t *)get_element_count((CVmObjVector *)0x34d111);
    this_01 = (vm_val_t *)0x0;
    for (local_48 = (vm_val_t *)0x0; local_48 < this_00;
        local_48 = (vm_val_t *)((long)&local_48->typ + 1)) {
      get_element(in_RDI,(size_t)in_stack_ffffffffffffff88,(vm_val_t *)0x34d148);
      iVar1 = vm_val_t::equals(this_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (iVar1 == 0) {
        if (this_01 != local_48) {
          set_element_undo((CVmObjVector *)this_01,(vm_obj_id_t)((ulong)this_00 >> 0x20),
                           (size_t)in_stack_ffffffffffffffa0,
                           (vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                          );
        }
        this_01 = (vm_val_t *)((long)&this_01->typ + 1);
      }
    }
    if (this_01 != this_00) {
      set_element_count_undo((CVmObjVector *)ele_val._0_8_,in_stack_0000000c,unaff_retaddr);
    }
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_remove_element(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    vm_val_t *del_val;
    static CVmNativeCodeDesc desc(1);
    size_t src;
    size_t dst;
    size_t old_cnt;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to be removed */
    del_val = G_stk->get(0);

    /* the return value is 'self'; leave it on the stack */
    retval->set_obj(self);
    G_stk->push(retval);

    /* get the original number of elements */
    old_cnt = get_element_count();

    /* delete each element matching the given value */
    for (src = dst = 0 ; src < old_cnt ; ++src)
    {
        vm_val_t ele_val;

        /* get this element */
        get_element(src, &ele_val);

        /* 
         *   if this element doesn't match the value to be deleted, add it
         *   to the result vector 
         */
        if (!ele_val.equals(vmg_ del_val))
        {
            /* 
             *   This element is a keeper - if we're moving it to a new
             *   position (i.e., we've deleted any elements before this
             *   one), store it at its new position, keeping undo
             *   information.  If we're storing it at its same position,
             *   there's no need to re-store the value or keep any undo,
             *   since no change is involved.  
             */
            if (dst != src)
                set_element_undo(vmg_ self, dst, &ele_val);

            /* increment the write index past this element */
            ++dst;
        }
    }

    /* if the element count changed, set the new element count */
    if (dst != old_cnt)
        set_element_count_undo(vmg_ self, dst);

    /* discard gc protection and arguments */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}